

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int write_unknown_chunks(spng_ctx *ctx,spng_location location)

{
  int iVar1;
  uint local_2c;
  int ret;
  uint32_t i;
  spng_unknown_chunk *chunk;
  spng_location location_local;
  spng_ctx *ctx_local;
  
  if (((uint)ctx->stored >> 0x10 & 1) != 0) {
    _ret = ctx->chunk_list;
    for (local_2c = 0; local_2c < ctx->n_chunks; local_2c = local_2c + 1) {
      if ((_ret->location == location) &&
         (iVar1 = write_chunk(ctx,_ret->type,_ret->data,_ret->length), iVar1 != 0)) {
        return iVar1;
      }
      _ret = _ret + 1;
    }
  }
  return 0;
}

Assistant:

static int write_unknown_chunks(spng_ctx *ctx, enum spng_location location)
{
    if(!ctx->stored.unknown) return 0;

    const struct spng_unknown_chunk *chunk = ctx->chunk_list;

    uint32_t i;
    for(i=0; i < ctx->n_chunks; i++, chunk++)
    {
        if(chunk->location != location) continue;

        int ret = write_chunk(ctx, chunk->type, chunk->data, chunk->length);
        if(ret) return ret;
    }

    return 0;
}